

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> __thiscall
spvtools::opt::InlinePass::InlineBasicBlocks
          (InlinePass *this,
          vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          *new_blocks,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *new_blk_ptr,DebugInlinedAtContext *inlined_at_ctx,Function *calleeFn)

{
  bool bVar1;
  NonSemanticShaderDebugInfo100Instructions NVar2;
  uint32_t uVar3;
  pointer this_00;
  Instruction *pIVar4;
  pointer new_blk_ptr_00;
  IRContext *this_01;
  DebugInfoManager *this_02;
  Instruction *this_03;
  DebugScope *this_04;
  Function *in_stack_00000008;
  undefined1 local_90 [8];
  iterator inst_itr;
  iterator tail_inst_itr;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> local_78;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_70;
  uint32_t local_64;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_60;
  const_iterator mapItr;
  undefined1 local_48 [8];
  iterator callee_block_itr;
  DebugInlinedAtContext *inlined_at_ctx_local;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  *new_blk_ptr_local;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *callee2caller_local;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *new_blocks_local;
  InlinePass *this_local;
  
  callee_block_itr.iterator_._M_current =
       (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
       calleeFn;
  _local_48 = Function::begin(in_stack_00000008);
  UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
            ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
  while( true ) {
    _mapItr = Function::end(in_stack_00000008);
    bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48,
                       (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&mapItr);
    if (!bVar1) {
      std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
      unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  *)this,(unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                          *)inlined_at_ctx);
      return (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
              )(__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
                )this;
    }
    std::
    vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
    ::push_back((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 *)callee2caller,(value_type *)inlined_at_ctx);
    this_00 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                        ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
    pIVar4 = BasicBlock::GetLabelInst(this_00);
    local_64 = Instruction::result_id(pIVar4);
    local_60._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 *)new_blk_ptr,&local_64);
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                *)new_blk_ptr);
    bVar1 = std::__detail::operator==(&local_60,&local_70);
    if (bVar1) break;
    std::__detail::_Node_const_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
    operator->((_Node_const_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false> *)
               &local_60);
    NewLabel((InlinePass *)&tail_inst_itr,(uint32_t)new_blocks);
    MakeUnique<spvtools::opt::BasicBlock,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
              ((spvtools *)&local_78,
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)&tail_inst_itr);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    operator=((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               *)inlined_at_ctx,&local_78);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr(&local_78);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 *)&tail_inst_itr);
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
    BasicBlock::end((BasicBlock *)&inst_itr);
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
    BasicBlock::begin((BasicBlock *)local_90);
    while (bVar1 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)local_90,
                                     &inst_itr.super_iterator), bVar1) {
      pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)local_90);
      NVar2 = Instruction::GetShader100DebugOpcode(pIVar4);
      if (NVar2 != NonSemanticShaderDebugInfo100DebugFunctionDefinition) {
        new_blk_ptr_00 =
             std::
             unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ::get((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    *)inlined_at_ctx);
        pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator*
                           ((iterator_template<spvtools::opt::Instruction> *)local_90);
        this_01 = Pass::context((Pass *)new_blocks);
        this_02 = IRContext::get_debug_info_mgr(this_01);
        this_03 = utils::IntrusiveList<spvtools::opt::Instruction>::
                  iterator_template<spvtools::opt::Instruction>::operator->
                            ((iterator_template<spvtools::opt::Instruction> *)local_90);
        this_04 = Instruction::GetDebugScope(this_03);
        uVar3 = DebugScope::GetInlinedAt(this_04);
        uVar3 = analysis::DebugInfoManager::BuildDebugInlinedAtChain
                          (this_02,uVar3,
                           (DebugInlinedAtContext *)callee_block_itr.iterator_._M_current);
        bVar1 = InlineSingleInstruction
                          ((InlinePass *)new_blocks,
                           (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            *)new_blk_ptr,new_blk_ptr_00,pIVar4,uVar3);
        if (!bVar1) {
          std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>
          ::unique_ptr<std::default_delete<spvtools::opt::BasicBlock>,void>
                    ((unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>
                      *)this,(nullptr_t)0x0);
          return (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
                  )(__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
                    )this;
        }
      }
      InstructionList::iterator::operator++((iterator *)local_90);
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48);
  }
  std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>::
  unique_ptr<std::default_delete<spvtools::opt::BasicBlock>,void>
            ((unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>> *
             )this,(nullptr_t)0x0);
  return (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<BasicBlock> InlinePass::InlineBasicBlocks(
    std::vector<std::unique_ptr<BasicBlock>>* new_blocks,
    const std::unordered_map<uint32_t, uint32_t>& callee2caller,
    std::unique_ptr<BasicBlock> new_blk_ptr,
    analysis::DebugInlinedAtContext* inlined_at_ctx, Function* calleeFn) {
  auto callee_block_itr = calleeFn->begin();
  ++callee_block_itr;

  while (callee_block_itr != calleeFn->end()) {
    new_blocks->push_back(std::move(new_blk_ptr));
    const auto mapItr =
        callee2caller.find(callee_block_itr->GetLabelInst()->result_id());
    if (mapItr == callee2caller.end()) return nullptr;
    new_blk_ptr = MakeUnique<BasicBlock>(NewLabel(mapItr->second));

    auto tail_inst_itr = callee_block_itr->end();
    for (auto inst_itr = callee_block_itr->begin(); inst_itr != tail_inst_itr;
         ++inst_itr) {
      // Don't inline function definition links, the calling function is not a
      // definition
      if (inst_itr->GetShader100DebugOpcode() ==
          NonSemanticShaderDebugInfo100DebugFunctionDefinition)
        continue;
      if (!InlineSingleInstruction(
              callee2caller, new_blk_ptr.get(), &*inst_itr,
              context()->get_debug_info_mgr()->BuildDebugInlinedAtChain(
                  inst_itr->GetDebugScope().GetInlinedAt(), inlined_at_ctx))) {
        return nullptr;
      }
    }

    ++callee_block_itr;
  }
  return new_blk_ptr;
}